

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O3

bool __thiscall
GoState<3U,_3U>::is_alive
          (GoState<3U,_3U> *this,int i_start,int j_start,
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *pieces)

{
  uchar uVar1;
  uchar uVar2;
  iterator iVar3;
  bool bVar4;
  int j;
  int i;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> stack;
  value_type back;
  uint local_70;
  uint local_6c;
  key_type local_68;
  int local_60;
  int local_5c;
  void *local_58;
  void *pvStack_50;
  undefined8 local_48;
  key_type local_38;
  
  if (this->board[i_start][j_start] == '\0') {
    bVar4 = true;
  }
  else {
    local_58 = (void *)0x0;
    pvStack_50 = (void *)0x0;
    local_48 = 0;
    local_60 = j_start;
    local_5c = i_start;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::clear(&pieces->_M_t);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,&local_5c,
               &local_60);
    if (local_58 != pvStack_50) {
      uVar1 = this->board[local_5c][local_60];
      do {
        local_38 = *(key_type *)((long)pvStack_50 + -8);
        pvStack_50 = (void *)((long)pvStack_50 + -8);
        iVar3 = std::
                _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                ::find(&pieces->_M_t,&local_38);
        if ((_Rb_tree_header *)iVar3._M_node == &(pieces->_M_t)._M_impl.super__Rb_tree_header) {
          local_6c = local_38.first;
          local_70 = local_38.second;
          uVar2 = this->board[local_38.first][local_38.second];
          if (uVar2 == uVar1) {
            local_68 = local_38;
            std::
            _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::_M_insert_unique<std::pair<int,int>>
                      ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)pieces,&local_68);
            if (0 < (int)local_6c) {
              local_68.first = local_6c - 1;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<int,int&>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         &local_68.first,(int *)&local_70);
            }
            if (local_6c < 2) {
              local_68.first = local_6c + 1;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<int,int&>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         &local_68.first,(int *)&local_70);
            }
            if (0 < (int)local_70) {
              local_68.first = local_70 - 1;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<int&,int>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         (int *)&local_6c,&local_68.first);
            }
            if (local_70 < 2) {
              local_68.first = local_70 + 1;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<int&,int>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_58,
                         (int *)&local_6c,&local_68.first);
            }
          }
          else if (uVar2 == '\0') {
            bVar4 = true;
            goto LAB_00143a36;
          }
        }
      } while (local_58 != pvStack_50);
    }
    bVar4 = false;
LAB_00143a36:
    if (local_58 != (void *)0x0) {
      operator_delete(local_58);
    }
  }
  return bVar4;
}

Assistant:

virtual bool is_alive(int i_start, int j_start, std::set<std::pair<int, int>>* pieces) const
	{
		if (board[i_start][j_start] == empty) {
			// No piece here, so alive
			return true;
		}

		std::vector<std::pair<int, int>> stack;
		pieces->clear();
		stack.emplace_back(i_start, j_start);
		int player = board[i_start][j_start];

		while (!stack.empty()) {
			auto back = stack.back();
			stack.pop_back();
			if (pieces->find(back) != pieces->end()) {
				// Already checked.
				continue;
			}
			int i,j;
			std::tie(i, j) = back;
			
			if (board[i][j] == player) {

				// Does not work in older GCC.
				//pieces->emplace(i, j);
				pieces->insert(std::make_pair(i, j));

				if (i > 0) {
					stack.emplace_back(i - 1, j);
				}
				if (i < M - 1) {
					stack.emplace_back(i + 1, j);
				}
				if (j > 0) {
					stack.emplace_back(i, j - 1);
				}
				if (j < N - 1) {
					stack.emplace_back(i, j + 1);
				}
			}
			else if (board[i][j] == empty) {
				// Alive.
				return true;
			}
		}
		return false;
	}